

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeDensityZ.cpp
# Opt level: O0

void __thiscall OpenMD::ChargeDensityZ::process(ChargeDensityZ *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  mapped_type_conflict mVar6;
  bool bVar7;
  SnapshotManager *pSVar8;
  Snapshot *pSVar9;
  reference pdVar10;
  size_type sVar11;
  reference pvVar12;
  double *pdVar13;
  char *pcVar14;
  mapped_type *this_00;
  mapped_type *pmVar15;
  mapped_type_conflict *pmVar16;
  pointer ppVar17;
  reference pvVar18;
  mapped_type *pmVar19;
  int iVar20;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar21;
  RealType RVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double extraout_XMM0_Qa;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *extraout_XMM0_Qa_00;
  SelectionEvaluator *extraout_XMM0_Qa_01;
  SelectionManager *extraout_XMM0_Qa_02;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar31;
  RealType gaussian_scale;
  RealType zdist;
  RealType z;
  size_t i_2;
  RealType chargeDiffUsingFirstFrameAverage;
  RealType chargeDiff;
  RealType charge;
  RealType z_pos;
  size_t index;
  RealType v_radius2;
  RealType v_radius;
  RealType averageChargeUsingFirstFrame;
  RealType averageCharge;
  string a_name_1;
  int key;
  iterator it_1;
  RealType epsilon;
  string a_name;
  int g_Index;
  iterator it;
  int globalIndex;
  Vector3d pos;
  iterator i_1;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  string atomName;
  RealType sigma;
  int obanum;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  Atom *atom;
  RealType q;
  StuntDouble *sd;
  int kk;
  int i;
  RealType sliceVolume;
  RealType area;
  vector<int,_std::allocator<int>_> cartesian_axis;
  iterator axis_it;
  set<int,_std::less<int>,_std::allocator<int>_> axisValues;
  RealType zAve;
  RealType zSum;
  iterator j;
  int nFrames_;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  Snapshot *in_stack_ffffffffffffe728;
  DumpReader *in_stack_ffffffffffffe730;
  ElementsTable *in_stack_ffffffffffffe738;
  SelectionManager *in_stack_ffffffffffffe740;
  value_type_conflict *in_stack_ffffffffffffe748;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffe750;
  SelectionEvaluator *in_stack_ffffffffffffe768;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_ffffffffffffe770;
  AtomType *in_stack_ffffffffffffe7a8;
  Snapshot *in_stack_ffffffffffffe7b0;
  undefined8 in_stack_ffffffffffffe7b8;
  DumpReader *in_stack_ffffffffffffe7c0;
  double local_1810;
  double local_1808;
  string *in_stack_ffffffffffffe980;
  SimInfo *in_stack_ffffffffffffe988;
  undefined7 in_stack_ffffffffffffe990;
  undefined1 in_stack_ffffffffffffe997;
  ulong local_15a0;
  ulong local_1578;
  string local_1550 [36];
  int local_152c;
  _Self local_1528;
  _Self local_1520;
  double local_1518;
  string local_1510 [36];
  int local_14ec;
  _Self local_14e8;
  _Self local_14e0;
  int local_14d4;
  Vector<double,_3U> local_14b8;
  string local_14a0 [32];
  string local_1480 [32];
  AtomType **local_1460;
  AtomType **local_1458;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_1450 [4];
  string local_1430 [32];
  mapped_type_conflict local_1410;
  int local_1404;
  FluctuatingChargeAdapter local_1400;
  FixedChargeAdapter local_13f8;
  AtomType *local_13f0;
  Atom *local_13e8;
  double local_13e0;
  Atom *local_13d8;
  int local_13ac;
  double local_13a8;
  double local_13a0;
  _Self local_1398;
  _Base_ptr local_1390;
  vector<int,_std::allocator<int>_> local_1388;
  _Rb_tree_const_iterator<int> local_1370;
  _Base_ptr local_1368;
  undefined1 local_1360;
  undefined4 local_1354;
  _Base_ptr local_1350;
  undefined1 local_1348;
  undefined4 local_133c;
  _Base_ptr local_1338;
  undefined1 local_1330;
  undefined4 local_1324;
  double local_12f0;
  double *local_12e8;
  double *local_12e0;
  double local_12d8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_12d0 [12];
  int local_126c;
  byte local_9;
  
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  local_9 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x2028f0);
  DumpReader::DumpReader
            ((DumpReader *)CONCAT17(in_stack_ffffffffffffe997,in_stack_ffffffffffffe990),
             in_stack_ffffffffffffe988,in_stack_ffffffffffffe980);
  local_126c = DumpReader::getNFrames(in_stack_ffffffffffffe730);
  *(int *)(in_RDI + 0x1a) = local_126c / (int)in_RDI[6];
  DumpReader::readFrame(in_stack_ffffffffffffe7c0,(int)((ulong)in_stack_ffffffffffffe7b8 >> 0x20));
  pSVar8 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
  pSVar9 = SnapshotManager::getCurrentSnapshot(pSVar8);
  in_RDI[0x19] = (long)pSVar9;
  Snapshot::getHmat(in_stack_ffffffffffffe728);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_stack_ffffffffffffe730,
             (SquareMatrix3<double> *)in_stack_ffffffffffffe728);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x202a03);
  RectMatrix<double,_3U,_3U>::operator()
            ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x107),*(uint *)(in_RDI + 0xfb),
             *(uint *)(in_RDI + 0xfb));
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe740,
             (value_type_conflict2 *)in_stack_ffffffffffffe738);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(local_12d0);
  local_12d8 = 0.0;
  local_12e0 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe728);
  local_12d0[0]._M_current = local_12e0;
  while( true ) {
    local_12e8 = (double *)
                 std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe728);
    bVar7 = __gnu_cxx::operator!=
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffe730,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_ffffffffffffe728);
    local_12f0 = local_12d8;
    if (!bVar7) break;
    pdVar10 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator*(local_12d0);
    local_12d8 = *pdVar10 + local_12d8;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_12d0);
  }
  sVar11 = std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe3));
  auVar28._8_4_ = (int)(sVar11 >> 0x20);
  auVar28._0_8_ = sVar11;
  auVar28._12_4_ = 0x45300000;
  local_12f0 = local_12f0 /
               ((auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0));
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x202bba);
  local_1324 = 0;
  pVar31 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     (in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  local_1338 = (_Base_ptr)pVar31.first._M_node;
  local_1330 = pVar31.second;
  local_133c = 1;
  pVar31 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     (in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  local_1350 = (_Base_ptr)pVar31.first._M_node;
  local_1348 = pVar31.second;
  local_1354 = 2;
  pVar31 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                     (in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
  local_1368 = (_Base_ptr)pVar31.first._M_node;
  local_1360 = pVar31.second;
  std::set<int,_std::less<int>,_std::allocator<int>_>::erase
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffe730,
             (key_type *)in_stack_ffffffffffffe728);
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_1370);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x202cdf);
  local_1390 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_ffffffffffffe728);
  local_1370._M_node = local_1390;
  while( true ) {
    local_1398._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffe728);
    bVar7 = std::operator!=(&local_1370,&local_1398);
    if (!bVar7) break;
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffe730);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe740,
               (value_type_conflict *)in_stack_ffffffffffffe738);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffe730);
  }
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_1388,0);
  *(value_type *)((long)in_RDI + 0x7dc) = *pvVar12;
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_1388,1);
  *(value_type *)(in_RDI + 0xfc) = *pvVar12;
  pdVar13 = RectMatrix<double,_3U,_3U>::operator()
                      ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x107),
                       *(uint *)((long)in_RDI + 0x7dc),*(uint *)((long)in_RDI + 0x7dc));
  dVar23 = *pdVar13;
  pdVar13 = RectMatrix<double,_3U,_3U>::operator()
                      ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x107),*(uint *)(in_RDI + 0xfc),
                       *(uint *)(in_RDI + 0xfc));
  dVar1 = local_12f0;
  local_13a0 = dVar23 * *pdVar13;
  sVar11 = std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe6));
  auVar29._8_4_ = (int)(sVar11 >> 0x20);
  auVar29._0_8_ = sVar11;
  auVar29._12_4_ = 0x45300000;
  local_13a8 = (dVar1 / ((auVar29._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar11) - 4503599627370496.0))) *
               local_13a0;
  local_13ac = 1;
  do {
    if (local_126c <= local_13ac) {
      local_1518 = 1e-10;
      local_1520._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffe728);
      while( true ) {
        local_1528._M_node =
             (_Base_ptr)
             std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_ffffffffffffe728);
        bVar7 = std::operator!=(&local_1520,&local_1528);
        if (!bVar7) break;
        ppVar17 = std::
                  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)0x203b80);
        local_152c = ppVar17->first;
        ppVar17 = std::
                  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)0x203b96);
        std::__cxx11::string::string(local_1550,(string *)&ppVar17->second);
        pmVar16 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                              *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
        dVar23 = *pmVar16;
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
        dVar1 = *pmVar16;
        pmVar16 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                              *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
        dVar2 = *pmVar16;
        local_1578 = 0;
        while( true ) {
          pmVar19 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
          sVar11 = std::vector<double,_std::allocator<double>_>::size(pmVar19);
          if (sVar11 <= local_1578) break;
          pmVar19 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[](pmVar19,local_1578);
          dVar3 = *pvVar18;
          pmVar19 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
          pvVar18 = std::vector<double,_std::allocator<double>_>::operator[](pmVar19,local_1578);
          dVar4 = *pvVar18;
          if (ABS(dVar4 - dVar23) <= local_1518) {
            local_1808 = 0.0;
          }
          else {
            local_1808 = dVar4 - dVar23;
          }
          if (ABS(dVar4 - dVar1) <= local_1518) {
            local_1810 = 0.0;
          }
          else {
            local_1810 = dVar4 - dVar1;
          }
          for (local_15a0 = 0;
              sVar11 = std::vector<double,_std::allocator<double>_>::size
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xef)),
              local_15a0 < sVar11; local_15a0 = local_15a0 + 1) {
            dVar24 = local_12f0 * -0.5;
            auVar27._8_4_ = (int)(local_15a0 >> 0x20);
            auVar27._0_8_ = local_15a0;
            auVar27._12_4_ = 0x45300000;
            dVar25 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_15a0) - 4503599627370496.0)) *
                     local_12f0;
            pvVar21 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xe6);
            sVar11 = std::vector<double,_std::allocator<double>_>::size(pvVar21);
            auVar30._8_4_ = (int)(sVar11 >> 0x20);
            auVar30._0_8_ = sVar11;
            auVar30._12_4_ = 0x45300000;
            dVar24 = dVar3 - (dVar25 / ((auVar30._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)sVar11) -
                                       4503599627370496.0)) + dVar24);
            dVar26 = exp((-dVar24 * dVar24) / (dVar2 * dVar2 + dVar2 * dVar2));
            dVar24 = local_13a8;
            dVar25 = sqrt(dVar2 * 6.283185307179586 * dVar2);
            dVar26 = dVar26 / (dVar24 * dVar25);
            dVar24 = dVar4;
            pvVar18 = std::vector<double,_std::allocator<double>_>::operator[](pvVar21,local_15a0);
            *pvVar18 = dVar24 * dVar26 + *pvVar18;
            pvVar21 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xef);
            pvVar18 = std::vector<double,_std::allocator<double>_>::operator[](pvVar21,local_15a0);
            *pvVar18 = local_1808 * dVar26 + *pvVar18;
            iVar20 = (int)pvVar21;
            std::abs(iVar20);
            std::abs(iVar20);
            dVar25 = extraout_XMM0_Qa * (double)extraout_XMM0_Qa_00;
            dVar24 = dVar26;
            in_stack_ffffffffffffe770 = extraout_XMM0_Qa_00;
            pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf2),
                                 local_15a0);
            *pvVar18 = dVar25 * dVar24 + *pvVar18;
            pvVar21 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xf5);
            pvVar18 = std::vector<double,_std::allocator<double>_>::operator[](pvVar21,local_15a0);
            *pvVar18 = local_1810 * dVar26 + *pvVar18;
            iVar20 = (int)pvVar21;
            std::abs(iVar20);
            in_stack_ffffffffffffe768 = extraout_XMM0_Qa_01;
            std::abs(iVar20);
            in_stack_ffffffffffffe730 =
                 (DumpReader *)((double)in_stack_ffffffffffffe768 * (double)extraout_XMM0_Qa_02);
            in_stack_ffffffffffffe740 = extraout_XMM0_Qa_02;
            pvVar18 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8),
                                 local_15a0);
            *pvVar18 = (double)in_stack_ffffffffffffe730 * dVar26 + *pvVar18;
          }
          local_1578 = local_1578 + 1;
        }
        std::__cxx11::string::~string(local_1550);
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffe730);
      }
      (**(code **)(*in_RDI + 0x20))();
      if ((*(byte *)(in_RDI + 0x106) & 1) != 0) {
        (**(code **)(*in_RDI + 0x28))();
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe740);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2042da);
      DumpReader::~DumpReader(in_stack_ffffffffffffe730);
      return;
    }
    DumpReader::readFrame(in_stack_ffffffffffffe7c0,(int)((ulong)in_stack_ffffffffffffe7b8 >> 0x20))
    ;
    pSVar8 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
    pSVar9 = SnapshotManager::getCurrentSnapshot(pSVar8);
    in_RDI[0x19] = (long)pSVar9;
    bVar7 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
    if (bVar7) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffe768);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffe740,(SelectionSet *)in_stack_ffffffffffffe738);
      SelectionSet::~SelectionSet((SelectionSet *)0x202fc7);
    }
    local_13d8 = (Atom *)SelectionManager::beginSelected
                                   (in_stack_ffffffffffffe740,(int *)in_stack_ffffffffffffe738);
    while (local_13d8 != (Atom *)0x0) {
      bVar7 = StuntDouble::isAtom(&local_13d8->super_StuntDouble);
      if (!bVar7) {
        snprintf(painCave.errMsg,2000,
                 "Can not calculate charge density distribution if it is not atom\n");
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      local_13e0 = 0.0;
      local_13e8 = local_13d8;
      local_13f0 = Atom::getAtomType(local_13d8);
      bVar7 = StuntDouble::isAtom(&local_13d8->super_StuntDouble);
      if (bVar7) {
        FixedChargeAdapter::FixedChargeAdapter(&local_13f8,local_13f0);
        bVar7 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x20312b);
        if (bVar7) {
          RVar22 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffe730);
          local_13e0 = RVar22 + local_13e0;
        }
        FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_1400,local_13f0);
        bVar7 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x203198);
        if (bVar7) {
          RVar22 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffe730);
          local_13e0 = RVar22 + local_13e0;
        }
      }
      local_1404 = 0;
      local_1410 = 0.0;
      std::__cxx11::string::string(local_1430);
      AtomType::allYourBase(in_stack_ffffffffffffe7a8);
      __gnu_cxx::
      __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
      ::__normal_iterator(local_1450);
      local_1458 = (AtomType **)
                   std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::begin
                             ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                              in_stack_ffffffffffffe728);
      local_1450[0]._M_current = local_1458;
      while( true ) {
        local_1460 = (AtomType **)
                     std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::end
                               ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                                in_stack_ffffffffffffe728);
        bVar7 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                            *)in_stack_ffffffffffffe730,
                           (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                            *)in_stack_ffffffffffffe728);
        if (!bVar7) break;
        __gnu_cxx::
        __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
        ::operator*(local_1450);
        AtomType::getName_abi_cxx11_((AtomType *)in_stack_ffffffffffffe728);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::operator=(local_1430,pcVar14);
        std::__cxx11::string::~string(local_1480);
        __gnu_cxx::
        __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
        ::operator*(local_1450);
        AtomType::getName_abi_cxx11_((AtomType *)in_stack_ffffffffffffe728);
        std::__cxx11::string::c_str();
        local_1404 = ElementsTable::GetAtomicNum
                               ((ElementsTable *)in_stack_ffffffffffffe730,
                                (char *)in_stack_ffffffffffffe728);
        std::__cxx11::string::~string(local_14a0);
        if (local_1404 != 0) {
          local_1410 = ElementsTable::GetVdwRad
                                 (in_stack_ffffffffffffe738,
                                  (int)((ulong)in_stack_ffffffffffffe730 >> 0x20));
          break;
        }
        __gnu_cxx::
        __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
        ::operator++(local_1450);
      }
      if (local_1404 == 0) {
        local_1410 = (mapped_type_conflict)in_RDI[0xfd];
      }
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe738);
      if ((local_9 & 1) != 0) {
        Snapshot::wrapVector(in_stack_ffffffffffffe7b0,(Vector3d *)in_stack_ffffffffffffe7a8);
      }
      StuntDouble::setPos((StuntDouble *)in_stack_ffffffffffffe740,
                          (Vector3d *)in_stack_ffffffffffffe738);
      StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe738);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_ffffffffffffe730,
                 (Vector3<double> *)in_stack_ffffffffffffe728);
      local_14d4 = StuntDouble::getGlobalIndex(&local_13d8->super_StuntDouble);
      this_00 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      std::__cxx11::string::operator=((string *)this_00,local_1430);
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      iVar20 = *pmVar15;
      pmVar16 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      dVar23 = (double)iVar20 * *pmVar16 + local_13e0;
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      iVar20 = *pmVar15;
      pmVar16 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      *pmVar16 = dVar23 / (double)(iVar20 + 1);
      std::
      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator[](in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe740,
                 (value_type_conflict2 *)in_stack_ffffffffffffe738);
      std::
      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator[](in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      Vector<double,_3U>::operator[](&local_14b8,*(uint *)(in_RDI + 0xfb));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe740,
                 (value_type_conflict2 *)in_stack_ffffffffffffe738);
      std::
      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator[](in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      Vector<double,_3U>::operator[](&local_14b8,*(uint *)((long)in_RDI + 0x7dc));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe740,
                 (value_type_conflict2 *)in_stack_ffffffffffffe738);
      std::
      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator[](in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      Vector<double,_3U>::operator[](&local_14b8,*(uint *)(in_RDI + 0xfc));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe740,
                 (value_type_conflict2 *)in_stack_ffffffffffffe738);
      mVar6 = local_1410;
      pmVar16 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      *pmVar16 = mVar6;
      pmVar15 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                            *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      *pmVar15 = *pmVar15 + 1;
      std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
                ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                 in_stack_ffffffffffffe740);
      std::__cxx11::string::~string(local_1430);
      local_13d8 = (Atom *)SelectionManager::nextSelected
                                     (in_stack_ffffffffffffe740,(int *)in_stack_ffffffffffffe738);
    }
    local_14e0._M_node =
         (_Base_ptr)
         std::
         map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe728);
    while( true ) {
      local_14e8._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffe728);
      bVar7 = std::operator!=(&local_14e0,&local_14e8);
      if (!bVar7) break;
      ppVar17 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x2038e7);
      local_14ec = ppVar17->first;
      ppVar17 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x2038fd);
      std::__cxx11::string::string(local_1510,(string *)&ppVar17->second);
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      iVar20 = *pmVar15;
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                              *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      dVar23 = *pmVar16;
      std::
      map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
      ::operator[](in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      pvVar18 = std::vector<double,_std::allocator<double>_>::front
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe730);
      dVar1 = *pvVar18;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      iVar5 = *pmVar15;
      pmVar16 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                              *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      *pmVar16 = ((double)iVar20 * dVar23 + dVar1) / (double)(iVar5 + 1);
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                              *)in_stack_ffffffffffffe770,(key_type *)in_stack_ffffffffffffe768);
      *pmVar15 = *pmVar15 + 1;
      std::__cxx11::string::~string(local_1510);
      std::
      _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffe730);
    }
    local_13ac = (int)in_RDI[6] + local_13ac;
  } while( true );
}

Assistant:

void ChargeDensityZ::process() {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames_ = reader.getNFrames();
    nProcessed_  = nFrames_ / step_;

    // test using global index starts hereby

    reader.readFrame(1);
    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    hmat_ = currentSnapshot_->getHmat();
    zBox_.push_back(hmat_(axis_, axis_));

    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }

    RealType zAve = zSum / zBox_.size();
    set<int> axisValues;
    axisValues.insert(0);
    axisValues.insert(1);
    axisValues.insert(2);
    axisValues.erase(axis_);
    set<int>::iterator axis_it;
    std::vector<int> cartesian_axis;
    for (axis_it = axisValues.begin(); axis_it != axisValues.end(); ++axis_it) {
      cartesian_axis.push_back(*axis_it);
    }
    x_                   = cartesian_axis[0];
    y_                   = cartesian_axis[1];
    RealType area        = hmat_(x_, x_) * hmat_(y_, y_);
    RealType sliceVolume = zAve / densityZAverageAllFrame_.size() * area;

    for (int i = 1; i < nFrames_; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      int kk;
      for (StuntDouble* sd = seleMan_.beginSelected(kk); sd != NULL;
           sd              = seleMan_.nextSelected(kk)) {
        if (!sd->isAtom()) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not calculate charge density distribution if it is not "
                   "atom\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType q = 0.0;
        Atom* atom = static_cast<Atom*>(sd);

        AtomType* atomType = atom->getAtomType();

        if (sd->isAtom()) {
          FixedChargeAdapter fca = FixedChargeAdapter(atomType);
          if (fca.isFixedCharge()) { q += fca.getCharge(); }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
          if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
        }
        int obanum(0);
        RealType sigma(0);
        std::string atomName;
        std::vector<AtomType*> atChain = atomType->allYourBase();
        std::vector<AtomType*>::iterator i;
        for (i = atChain.begin(); i != atChain.end(); ++i) {
          atomName = (*i)->getName().c_str();
          obanum   = etab.GetAtomicNum((*i)->getName().c_str());
          if (obanum != 0) {
            sigma = etab.GetVdwRad(obanum);
            break;
          }
        }
        if (obanum == 0) { sigma = vRadius_; }

        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);

        pos = sd->getPos();

        int globalIndex = sd->getGlobalIndex();

        atomNameGlobalIndex_[globalIndex] = atomName;
        averageChargeUsingGlobalIndex_[globalIndex] =
            (countUsingGlobalIndex_[globalIndex] *
                 averageChargeUsingGlobalIndex_[globalIndex] +
             q) /
            (countUsingGlobalIndex_[globalIndex] + 1);
        totalChargeUsingGlobalIndex_[globalIndex].push_back(q);
        zPosUsingGlobalIndex_[globalIndex].push_back(pos[axis_]);
        xPosUsingGlobalIndex_[globalIndex].push_back(pos[x_]);
        yPosUsingGlobalIndex_[globalIndex].push_back(pos[y_]);

        vanderRUsingGlobalIndex_[globalIndex] = sigma;
        countUsingGlobalIndex_[globalIndex]++;
      }

      for (std::map<int, std::string>::iterator it =
               atomNameGlobalIndex_.begin();
           it != atomNameGlobalIndex_.end(); ++it) {
        int g_Index        = it->first;
        std::string a_name = it->second;
        averageChargeForEachType_[a_name] =
            (SDCount_[a_name] * averageChargeForEachType_[a_name] +
             totalChargeUsingGlobalIndex_[g_Index].front()) /
            (SDCount_[a_name] + 1);
        SDCount_[a_name]++;
      }
    }
    RealType epsilon = 1e-10;
    for (std::map<int, std::string>::iterator it = atomNameGlobalIndex_.begin();
         it != atomNameGlobalIndex_.end(); ++it) {
      int key            = it->first;
      std::string a_name = it->second;

      RealType averageCharge = averageChargeUsingGlobalIndex_[key];
      RealType averageChargeUsingFirstFrame = averageChargeForEachType_[a_name];
      RealType v_radius                     = vanderRUsingGlobalIndex_[key];
      RealType v_radius2                    = v_radius * v_radius;
      for (size_t index = 0; index < zPosUsingGlobalIndex_[key].size();
           ++index) {
        RealType z_pos  = zPosUsingGlobalIndex_[key][index];
        RealType charge = totalChargeUsingGlobalIndex_[key][index];
        RealType chargeDiff =
            fabs(charge - averageCharge) > epsilon ? charge - averageCharge : 0;
        RealType chargeDiffUsingFirstFrameAverage =
            fabs(charge - averageChargeUsingFirstFrame) > epsilon ?
                charge - averageChargeUsingFirstFrame :
                0;

        for (size_t i = 0; i < densityFlucZAverageAllFrame_.size(); ++i) {
          RealType z = -zAve / 2 + i * zAve / densityZAverageAllFrame_.size();
          RealType zdist = z_pos - z;

          RealType gaussian_scale =
              exp(-zdist * zdist / (v_radius2 * 2.0)) /
              (sliceVolume * (sqrt(2 * Constants::PI * v_radius * v_radius)));
          densityZAverageAllFrame_[i] += charge * gaussian_scale;

          densityFlucZAverageAllFrame_[i] += chargeDiff * gaussian_scale;
          absDensityFlucZAverageAllFrame_[i] +=
              abs(chargeDiff) * abs(chargeDiff) * gaussian_scale;

          densityFlucZAverageFirstFrame_[i] +=
              chargeDiffUsingFirstFrameAverage * gaussian_scale;
          absDensityFlucZAverageFirstFrame_[i] +=
              abs(chargeDiffUsingFirstFrameAverage) *
              abs(chargeDiffUsingFirstFrameAverage) * gaussian_scale;
        }
      }
    }

    writeDensity();

    if (genXYZ_) generateXYZForLastFrame();
  }